

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::operator<(double lhs,Approx *rhs)

{
  bool local_19;
  Approx *rhs_local;
  double lhs_local;
  
  local_19 = false;
  if (lhs < rhs->m_value) {
    local_19 = operator!=(lhs,rhs);
  }
  return local_19;
}

Assistant:

bool operator<(double lhs, const Approx& rhs) { return lhs < rhs.m_value && lhs != rhs; }